

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O3

CharMapper<unsigned_char> * gmlc::utilities::digitMapper(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uchar uVar4;
  long lVar5;
  CharMapper<unsigned_char> *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  memset(in_RDI,0xff,0x100);
  auVar3 = _DAT_0043b1a0;
  auVar2 = _DAT_0043b190;
  auVar1 = _DAT_0043b180;
  lVar5 = 0;
  do {
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7 = (auVar6 | auVar2) ^ auVar3;
    uVar4 = (uchar)lVar5;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffff6) {
      (in_RDI->key)._M_elems[lVar5 + 0x30] = uVar4;
      (in_RDI->key)._M_elems[lVar5 + 0x31] = uVar4 + '\x01';
    }
    auVar6 = (auVar6 | auVar1) ^ auVar3;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7ffffff6) {
      (in_RDI->key)._M_elems[lVar5 + 0x32] = uVar4 + '\x02';
      (in_RDI->key)._M_elems[lVar5 + 0x33] = uVar4 + '\x03';
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  return in_RDI;
}

Assistant:

CharMapper<unsigned char> digitMapper()
{
    CharMapper<unsigned char> dMap(0xFF);
    unsigned char val = 0;
    for (unsigned char indexChar = '0'; indexChar <= '9'; ++indexChar) {
        dMap.addKey(indexChar, val);
        ++val;
    }
    return dMap;
}